

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::got_none::got_none(got_none *this,location *where_,text *expr_)

{
  allocator local_ea;
  allocator local_e9;
  string local_e8 [32];
  text local_c8;
  text local_a8;
  text local_88;
  location local_68;
  string local_40 [32];
  
  std::__cxx11::string::string(local_40,"passed: got no exception",&local_e9);
  std::__cxx11::string::string((string *)&local_88,local_40);
  location::location(&local_68,where_);
  std::__cxx11::string::string((string *)&local_a8,(string *)expr_);
  std::__cxx11::string::string(local_e8,"",&local_ea);
  std::__cxx11::string::string((string *)&local_c8,local_e8);
  success::success(&this->super_success,&local_88,&local_68,&local_a8,&local_c8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(undefined ***)&(this->super_success).super_message = &PTR__message_001a6d60;
  return;
}

Assistant:

got_none( location where_, text expr_)
    : success( "passed: got no exception", where_, expr_) {}